

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void StripNewline(char *str)

{
  int iVar1;
  bool bVar2;
  char *local_18;
  char *strPtr;
  char *str_local;
  
  for (local_18 = str; *local_18 != '\0'; local_18 = local_18 + 1) {
  }
  while( true ) {
    bVar2 = false;
    if (str < local_18) {
      iVar1 = iscntrl((uint)(byte)local_18[-1]);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_18 = local_18 + -1;
  }
  *local_18 = '\0';
  return;
}

Assistant:

static void StripNewline(char* str)
{
	char* strPtr;
	
	strPtr = str;
	while(*strPtr != '\0')
		strPtr ++;
	
	while(strPtr > str && iscntrl((unsigned char)strPtr[-1]))
		strPtr --;
	*strPtr = '\0';
	
	return;
}